

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmetatype.cpp
# Opt level: O3

char * QDBusMetaType::typeToSignature(QMetaType type)

{
  QHash<int,_QDBusCustomTypeInfo> *this;
  Span *pSVar1;
  Entry *pEVar2;
  bool bVar3;
  int iVar4;
  Type *pTVar5;
  QDBusCustomTypeInfo *this_00;
  uint uVar6;
  ulong uVar7;
  QMetaTypeInterface *in_RDI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypes>_> *this_01;
  char *pcVar8;
  Type *pTVar9;
  long in_FS_OFFSET;
  const_iterator cVar10;
  QDeadlineTimer QVar11;
  QDeadlineTimer QVar12;
  int local_5c;
  QByteArray local_58;
  QMetaType local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d_ptr = in_RDI;
  if (in_RDI != (QMetaTypeInterface *)0x0) {
    iVar4 = (in_RDI->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar4 == 0) {
      iVar4 = QMetaType::registerHelper(in_RDI);
    }
    if (iVar4 < 0x21) {
      switch(iVar4) {
      case 1:
        pcVar8 = "b";
        break;
      case 2:
        pcVar8 = "i";
        break;
      case 3:
        pcVar8 = "u";
        break;
      case 4:
        pcVar8 = "x";
        break;
      case 5:
        pcVar8 = "t";
        break;
      case 6:
        pcVar8 = "d";
        break;
      default:
        goto switchD_0016f791_caseD_7;
      case 10:
        pcVar8 = "s";
        break;
      case 0xb:
        pcVar8 = "as";
        break;
      case 0xc:
        pcVar8 = "ay";
      }
      goto LAB_0016f8c5;
    }
    if (iVar4 == 0x21) {
      pcVar8 = "n";
      goto LAB_0016f8c5;
    }
    if (iVar4 == 0x24) {
      pcVar8 = "q";
      goto LAB_0016f8c5;
    }
    if (iVar4 == 0x25) {
      pcVar8 = "y";
      goto LAB_0016f8c5;
    }
  }
switchD_0016f791_caseD_7:
  QDBusMetaTypeId::init((EVP_PKEY_CTX *)in_RDI);
  local_58.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QDBusVariant>::metaType;
  bVar3 = comparesEqual(&local_38,(QMetaType *)&local_58);
  if (bVar3) {
    pcVar8 = "v";
    goto LAB_0016f8c5;
  }
  local_58.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QDBusObjectPath>::metaType;
  bVar3 = comparesEqual(&local_38,(QMetaType *)&local_58);
  if (bVar3) {
    pcVar8 = "o";
    goto LAB_0016f8c5;
  }
  local_58.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QDBusSignature>::metaType;
  bVar3 = comparesEqual(&local_38,(QMetaType *)&local_58);
  if (bVar3) {
    pcVar8 = "g";
    goto LAB_0016f8c5;
  }
  local_58.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QDBusUnixFileDescriptor>::metaType;
  this_01 = (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypes>_> *)
            &local_38;
  bVar3 = comparesEqual((QMetaType *)this_01,(QMetaType *)&local_58);
  if (bVar3) {
    pcVar8 = "h";
    goto LAB_0016f8c5;
  }
  pTVar5 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_customTypes>_>::
           operator()(this_01);
  if (pTVar5 == (Type *)0x0) {
    pcVar8 = (char *)0x0;
    goto LAB_0016f8c5;
  }
  pTVar9 = pTVar5;
  if (((ulong)pTVar5 & 1) == 0) {
    QVar11.t2 = 0xffffffff;
    QVar11.type = 0x7fffffff;
    QVar11.t1 = (qint64)pTVar5;
    QReadWriteLock::tryLockForRead(QVar11);
    pTVar9 = (Type *)((ulong)pTVar5 | 1);
  }
  this = &pTVar5->hash;
  if (local_38.d_ptr == (QMetaTypeInterface *)0x0) {
    iVar4 = 0;
  }
  else {
    iVar4 = ((local_38.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
    if (iVar4 == 0) {
      iVar4 = QMetaType::registerHelper(local_38.d_ptr);
    }
  }
  local_58.d.d = (Data *)CONCAT44(local_58.d.d._4_4_,iVar4);
  cVar10 = QHash<int,_QDBusCustomTypeInfo>::constFindImpl<int>(this,(int *)&local_58);
  if (cVar10.i.d == (Data<QHashPrivate::Node<int,_QDBusCustomTypeInfo>_> *)0x0 &&
      cVar10.i.bucket == 0) {
    bVar3 = false;
LAB_0016f9ac:
    pcVar8 = (char *)0x0;
  }
  else {
    pSVar1 = (cVar10.i.d)->spans;
    uVar7 = cVar10.i.bucket >> 7;
    pEVar2 = pSVar1[uVar7].entries;
    uVar6 = (uint)pSVar1[uVar7].offsets[(uint)cVar10.i.bucket & 0x7f];
    pcVar8 = *(char **)((pEVar2->storage).data + (ulong)(uVar6 * 0x30) + 0x10);
    if (pcVar8 == (char *)0x0) {
      bVar3 = *(long *)((pEVar2->storage).data + (ulong)(uVar6 * 0x30) + 0x20) != 0;
      goto LAB_0016f9ac;
    }
    bVar3 = false;
  }
  if (((ulong)pTVar9 & 1) != 0) {
    QReadWriteLock::unlock();
  }
  if (bVar3) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QDBusArgumentPrivate::createSignature(&local_58,local_38);
    if (((ulong)pTVar5 & 1) == 0) {
      QVar12.t2 = 0xffffffff;
      QVar12.type = 0x7fffffff;
      QVar12.t1 = (qint64)pTVar5;
      QReadWriteLock::tryLockForWrite(QVar12);
      pTVar5 = (Type *)((ulong)pTVar5 | 1);
    }
    if (local_38.d_ptr == (QMetaTypeInterface *)0x0) {
      local_5c = 0;
    }
    else {
      local_5c = ((local_38.d_ptr)->typeId)._q_value.super___atomic_base<int>._M_i;
      if (local_5c == 0) {
        local_5c = QMetaType::registerHelper(local_38.d_ptr);
      }
    }
    this_00 = QHash<int,_QDBusCustomTypeInfo>::operator[](this,&local_5c);
    QByteArray::operator=(&this_00->signature,&local_58);
    if (((ulong)pTVar5 & 1) != 0) {
      QReadWriteLock::unlock();
    }
    if ((InterfaceType *)local_58.d.d != (InterfaceType *)0x0) {
      LOCK();
      *(int *)local_58.d.d = *(int *)local_58.d.d + -1;
      UNLOCK();
      if (*(int *)local_58.d.d == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,1,0x10);
      }
    }
    pcVar8 = (this_00->signature).d.ptr;
    if (pcVar8 == (char *)0x0) {
      pcVar8 = (char *)&QByteArray::_empty;
    }
  }
LAB_0016f8c5:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return pcVar8;
  }
  __stack_chk_fail();
}

Assistant:

const char *QDBusMetaType::typeToSignature(QMetaType type)
{
    // check if it's a static type
    switch (type.id())
    {
    case QMetaType::UChar:
        return DBUS_TYPE_BYTE_AS_STRING;

    case QMetaType::Bool:
        return DBUS_TYPE_BOOLEAN_AS_STRING;

    case QMetaType::Short:
        return DBUS_TYPE_INT16_AS_STRING;

    case QMetaType::UShort:
        return DBUS_TYPE_UINT16_AS_STRING;

    case QMetaType::Int:
        return DBUS_TYPE_INT32_AS_STRING;

    case QMetaType::UInt:
        return DBUS_TYPE_UINT32_AS_STRING;

    case QMetaType::LongLong:
        return DBUS_TYPE_INT64_AS_STRING;

    case QMetaType::ULongLong:
        return DBUS_TYPE_UINT64_AS_STRING;

    case QMetaType::Double:
        return DBUS_TYPE_DOUBLE_AS_STRING;

    case QMetaType::QString:
        return DBUS_TYPE_STRING_AS_STRING;

    case QMetaType::QStringList:
        return DBUS_TYPE_ARRAY_AS_STRING
            DBUS_TYPE_STRING_AS_STRING; // as

    case QMetaType::QByteArray:
        return DBUS_TYPE_ARRAY_AS_STRING
            DBUS_TYPE_BYTE_AS_STRING; // ay
    }

    QDBusMetaTypeId::init();
    if (type == QDBusMetaTypeId::variant())
        return DBUS_TYPE_VARIANT_AS_STRING;
    else if (type == QDBusMetaTypeId::objectpath())
        return DBUS_TYPE_OBJECT_PATH_AS_STRING;
    else if (type == QDBusMetaTypeId::signature())
        return DBUS_TYPE_SIGNATURE_AS_STRING;
    else if (type == QDBusMetaTypeId::unixfd())
        return DBUS_TYPE_UNIX_FD_AS_STRING;

    // try the database
    auto *ct = customTypes();
    if (!ct)
        return nullptr;

    {
        QReadLocker locker(&ct->lock);
        auto it = ct->hash.constFind(type.id());
        if (it == ct->hash.end())
            return nullptr;

        const QDBusCustomTypeInfo &info = *it;

        if (!info.signature.isNull())
            return info.signature;

        if (!info.marshall)
            return nullptr;           // type not registered with us
    }

    // call to user code to construct the signature type
    QDBusCustomTypeInfo *info;
    {
        // createSignature will never return a null QByteArray
        // if there was an error, it'll return ""
        QByteArray signature = QDBusArgumentPrivate::createSignature(type);

        // re-acquire lock
        QWriteLocker locker(&ct->lock);
        info = &ct->hash[type.id()];
        info->signature = signature;
    }
    return info->signature;
}